

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  bool bVar1;
  ostream *__lhs;
  pointer pMVar2;
  undefined8 *in_RDI;
  Colour colourGuard_1;
  Colour colourGuard;
  size_t N;
  const_iterator itEnd;
  undefined4 in_stack_ffffffffffffff28;
  Code in_stack_ffffffffffffff2c;
  pluralise *in_stack_ffffffffffffff30;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  in_stack_ffffffffffffff40;
  AssertionPrinter *this_00;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)in_stack_ffffffffffffff30,
                     (__normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (!bVar1) {
    clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::cend
              ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::
    distance<__gnu_cxx::__normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Colour::Colour((Colour *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    std::operator<<((ostream *)*in_RDI," with ");
    this_00 = (AssertionPrinter *)&stack0xffffffffffffff67;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    pluralise::pluralise
              (in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),(string *)0x151ebb);
    __lhs = Catch::operator<<((ostream *)in_stack_ffffffffffffff30,
                              (pluralise *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::operator<<(__lhs,':');
    pluralise::~pluralise((pluralise *)0x151eee);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    Colour::~Colour((Colour *)0x151f0f);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)__lhs,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffff2c,
                                                   in_stack_ffffffffffffff28)), bVar1) {
      if (((*(byte *)(in_RDI + 6) & 1) == 0) &&
         (pMVar2 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                 *)(in_RDI + 5)), pMVar2->type == Info)) {
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator++((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)(in_RDI + 5));
      }
      else {
        printMessage(this_00);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                            *)__lhs,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                          );
        if (bVar1) {
          anon_unknown.dwarf_f62fa::dimColour();
          Colour::Colour((Colour *)__lhs,in_stack_ffffffffffffff2c);
          std::operator<<((ostream *)*in_RDI," and");
          Colour::~Colour((Colour *)0x151fab);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = dimColour()) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(std::distance(itMessage, itEnd));

        {
            Colour colourGuard(colour);
            stream << " with " << pluralise(N, "message") << ':';
        }

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    Colour colourGuard(dimColour());
                    stream << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }